

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void * Thread::localStart(void *arg)

{
  bool bVar1;
  element_type *peVar2;
  code *local_98;
  undefined8 local_90;
  type local_88;
  shared_ptr<EventLoop> local_70 [2];
  code *local_50;
  undefined8 local_48;
  type local_40;
  undefined1 local_28 [8];
  SharedPtr loop;
  Thread *t;
  void *arg_local;
  
  loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg;
  (**(code **)(*arg + 0x10))();
  EventLoop::cleanupLocalEventLoop();
  bVar1 = isAutoDelete((Thread *)
                       loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
  if (bVar1) {
    std::weak_ptr<EventLoop>::lock((weak_ptr<EventLoop> *)local_28);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      local_50 = finish;
      local_48 = 0;
      std::bind<void(Thread::*)(),Thread*&>
                (&local_40,(offset_in_Thread_to_subr *)&local_50,
                 (Thread **)
                 &loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      EventLoop::callLater<std::_Bind<void(Thread::*(Thread*))()>>(peVar2,&local_40);
    }
    else {
      EventLoop::mainEventLoop();
      peVar2 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_70);
      local_98 = finish;
      local_90 = 0;
      std::bind<void(Thread::*)(),Thread*&>
                (&local_88,(offset_in_Thread_to_subr *)&local_98,
                 (Thread **)
                 &loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      EventLoop::callLater<std::_Bind<void(Thread::*(Thread*))()>>(peVar2,&local_88);
      std::shared_ptr<EventLoop>::~shared_ptr(local_70);
    }
    std::shared_ptr<EventLoop>::~shared_ptr((shared_ptr<EventLoop> *)local_28);
  }
  return (void *)0x0;
}

Assistant:

void* Thread::localStart(void* arg)
{
    Thread* t = static_cast<Thread*>(arg);
    t->run();
    EventLoop::cleanupLocalEventLoop();
    if (t->isAutoDelete()) {
        if (EventLoop::SharedPtr loop = t->mLoop.lock())
            loop->callLater(std::bind(&Thread::finish, t));
        else
            EventLoop::mainEventLoop()->callLater(std::bind(&Thread::finish, t));
    }
    return 0;
}